

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan_string(Lexer *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Token *in_RDI;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  
  uVar1 = (this->m_in)._M_len;
  uVar6 = this->pos;
  if (uVar6 < uVar1) {
    pcVar4 = (this->m_in)._M_str;
    uVar3 = this->tok_start;
    bVar5 = false;
    uVar2 = uVar6;
    do {
      uVar6 = uVar2 + 1;
      this->pos = uVar6;
      if (pcVar4[uVar2] == '\\') {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      else {
        if ((!bVar5) && (pcVar4[uVar2] == pcVar4[uVar3])) break;
        bVar5 = false;
      }
      uVar2 = uVar6;
    } while (uVar6 != uVar1);
  }
  else {
    pcVar4 = (this->m_in)._M_str;
    uVar3 = this->tok_start;
  }
  if (uVar1 < uVar3) {
    uVar3 = uVar1;
  }
  if (uVar6 < uVar3) {
    uVar6 = uVar3;
  }
  if (uVar1 <= uVar6) {
    uVar6 = uVar1;
  }
  uVar2 = uVar1 - uVar3;
  if (uVar6 - uVar3 <= uVar1 - uVar3) {
    uVar2 = uVar6 - uVar3;
  }
  in_RDI->kind = String;
  (in_RDI->text)._M_len = uVar2;
  (in_RDI->text)._M_str = pcVar4 + uVar3;
  return in_RDI;
}

Assistant:

Token scan_string() {
    bool escape {false};
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos++];
      if (ch == '\\') {
        escape = !escape;
      } else if (!escape && ch == m_in[tok_start]) {
        break;
      } else {
        escape = false;
      }
    }
    return make_token(Token::Kind::String);
  }